

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

InsideExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::InsideExpression,slang::ast::Type_const&,slang::ast::Expression_const&,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange>
          (BumpAllocator *this,Type *args,Expression *args_1,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_2,SourceRange *args_3)

{
  pointer ppEVar1;
  size_type sVar2;
  InsideExpression *this_00;
  
  this_00 = (InsideExpression *)allocate(this,0x48,8);
  ppEVar1 = args_2->data_;
  sVar2 = args_2->size_;
  ast::Expression::Expression((Expression *)this_00,Inside,args,*args_3);
  this_00->left_ = args_1;
  (this_00->rangeList_).data_ = ppEVar1;
  (this_00->rangeList_).size_ = sVar2;
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }